

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasKrylovDemo_ls.c
# Opt level: O1

void PrintHeader(sunrealtype rtol,sunrealtype atol,int linsolver)

{
  puts("\nidasKrylovDemo_ls: Heat equation, serial example problem for IDA");
  puts("                   Discretized heat equation on 2D unit square.");
  printf("                   Zero boundary conditions,");
  puts(" polynomial initial conditions.");
  printf("                   Mesh dimensions: %d x %d",10,10);
  printf("       Total system size: %d\n\n",100);
  printf("Tolerance parameters:  rtol = %g   atol = %g\n",0,0x3f50624dd2f1a9fc);
  puts("Constraints set to force all solution components >= 0. ");
  if ((uint)linsolver < 3) {
    puts(&DAT_00104750 + *(int *)(&DAT_00104750 + (ulong)(uint)linsolver * 4));
    return;
  }
  return;
}

Assistant:

static void PrintHeader(sunrealtype rtol, sunrealtype atol, int linsolver)
{
  printf(
    "\nidasKrylovDemo_ls: Heat equation, serial example problem for IDA\n");
  printf("                   Discretized heat equation on 2D unit square.\n");
  printf("                   Zero boundary conditions,");
  printf(" polynomial initial conditions.\n");
  printf("                   Mesh dimensions: %d x %d", MGRID, MGRID);
  printf("       Total system size: %d\n\n", NEQ);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Tolerance parameters:  rtol = %Lg   atol = %Lg\n", rtol, atol);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("Tolerance parameters:  rtol = %g   atol = %g\n", rtol, atol);
#else
  printf("Tolerance parameters:  rtol = %g   atol = %g\n", rtol, atol);
#endif
  printf("Constraints set to force all solution components >= 0. \n");

  switch (linsolver)
  {
  case (USE_SPGMR):
    printf("Linear solver: SPGMR, preconditioner using diagonal elements. \n");
    break;

  case (USE_SPBCG):
    printf("Linear solver: SPBCG, preconditioner using diagonal elements. \n");
    break;

  case (USE_SPTFQMR):
    printf(
      "Linear solver: SPTFQMR, preconditioner using diagonal elements. \n");
    break;
  }
}